

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O2

void __thiscall HighsInfo::initRecords(HighsInfo *this)

{
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *this_00;
  InfoRecordDouble *pIVar1;
  allocator local_5a1;
  InfoRecordDouble *local_5a0;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_38,"simplex_iteration_count",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_58,"Iteration count for simplex solver",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_38,&local_58,false,
             &(this->super_HighsInfoStruct).simplex_iteration_count,0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = &this->records;
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_78,"ipm_iteration_count",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_98,"Iteration count for IPM solver",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_78,&local_98,false,
             &(this->super_HighsInfoStruct).ipm_iteration_count,0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_b8,"crossover_iteration_count",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_d8,"Iteration count for crossover",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_b8,&local_d8,false,
             &(this->super_HighsInfoStruct).crossover_iteration_count,0);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_f8,"pdlp_iteration_count",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_118,"Iteration count for PDLP solver",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_f8,&local_118,false,
             &(this->super_HighsInfoStruct).pdlp_iteration_count,0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_138,"qp_iteration_count",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_158,"Iteration count for QP solver",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_138,&local_158,false,
             &(this->super_HighsInfoStruct).qp_iteration_count,0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_178,"primal_solution_status",(allocator *)&local_5a0);
  std::__cxx11::string::string
            ((string *)&local_198,
             "Model primal solution status: 0 => No solution; 1 => Infeasible point; 2 => Feasible point"
             ,&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_178,&local_198,false,
             &(this->super_HighsInfoStruct).primal_solution_status,0);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_1b8,"dual_solution_status",(allocator *)&local_5a0);
  std::__cxx11::string::string
            ((string *)&local_1d8,
             "Model dual solution status: 0 => No solution; 1 => Infeasible point; 2 => Feasible point"
             ,&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_1b8,&local_1d8,false,
             &(this->super_HighsInfoStruct).dual_solution_status,0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_1f8,"basis_validity",(allocator *)&local_5a0);
  std::__cxx11::string::string
            ((string *)&local_218,"Model basis validity: 0 => Invalid; 1 => Valid",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_1f8,&local_218,false,
             &(this->super_HighsInfoStruct).basis_validity,0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_238,"objective_function_value",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_258,"Objective function value",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_238,&local_258,false,
             &(this->super_HighsInfoStruct).objective_function_value,0.0);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_278,"mip_node_count",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_298,"MIP solver node count",&local_5a1);
  InfoRecordInt64::InfoRecordInt64
            ((InfoRecordInt64 *)pIVar1,&local_278,&local_298,false,
             &(this->super_HighsInfoStruct).mip_node_count,0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_2b8,"mip_dual_bound",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_2d8,"MIP solver dual bound",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_2b8,&local_2d8,false,&(this->super_HighsInfoStruct).mip_dual_bound,0.0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_2f8,"mip_gap",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_318,"MIP solver gap (%)",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_2f8,&local_318,false,&(this->super_HighsInfoStruct).mip_gap,0.0);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_338,"max_integrality_violation",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_358,"Max integrality violation",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_338,&local_358,false,
             &(this->super_HighsInfoStruct).max_integrality_violation,0.0);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_378,"num_primal_infeasibilities",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_398,"Number of primal infeasibilities",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_378,&local_398,false,
             &(this->super_HighsInfoStruct).num_primal_infeasibilities,-1);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_3b8,"max_primal_infeasibility",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_3d8,"Maximum primal infeasibility",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_3b8,&local_3d8,false,
             &(this->super_HighsInfoStruct).max_primal_infeasibility,0.0);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_3f8,"sum_primal_infeasibilities",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_418,"Sum of primal infeasibilities",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_3f8,&local_418,false,
             &(this->super_HighsInfoStruct).sum_primal_infeasibilities,0.0);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_438,"num_dual_infeasibilities",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_458,"Number of dual infeasibilities",&local_5a1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar1,&local_438,&local_458,false,
             &(this->super_HighsInfoStruct).num_dual_infeasibilities,-1);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_478,"max_dual_infeasibility",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_498,"Maximum dual infeasibility",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_478,&local_498,false,
             &(this->super_HighsInfoStruct).max_dual_infeasibility,0.0);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_4b8,"sum_dual_infeasibilities",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_4d8,"Sum of dual infeasibilities",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_4b8,&local_4d8,false,
             &(this->super_HighsInfoStruct).sum_dual_infeasibilities,0.0);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_4f8,"max_complementarity_violation",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_518,"Max complementarity violation",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_4f8,&local_518,false,
             &(this->super_HighsInfoStruct).max_complementarity_violation,0.0);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string
            ((string *)&local_538,"sum_complementarity_violations",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_558,"Sum of complementarity violations",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_538,&local_558,false,
             &(this->super_HighsInfoStruct).sum_complementarity_violations,0.0);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_538);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  pIVar1 = (InfoRecordDouble *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_578,"primal_dual_integral",(allocator *)&local_5a0);
  std::__cxx11::string::string((string *)&local_598,"Primal-dual integral",&local_5a1);
  InfoRecordDouble::InfoRecordDouble
            (pIVar1,&local_578,&local_598,false,&(this->super_HighsInfoStruct).primal_dual_integral,
             0.0);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_578);
  local_5a0 = pIVar1;
  std::vector<InfoRecord*,std::allocator<InfoRecord*>>::emplace_back<InfoRecord*>
            ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,(InfoRecord **)&local_5a0);
  return;
}

Assistant:

void initRecords() {
    InfoRecordInt64* record_int64;
    InfoRecordInt* record_int;
    InfoRecordDouble* record_double;
    const bool advanced = false;  // Not used

    record_int = new InfoRecordInt("simplex_iteration_count",
                                   "Iteration count for simplex solver",
                                   advanced, &simplex_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("ipm_iteration_count",
                                   "Iteration count for IPM solver", advanced,
                                   &ipm_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("crossover_iteration_count",
                                   "Iteration count for crossover", advanced,
                                   &crossover_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("pdlp_iteration_count",
                                   "Iteration count for PDLP solver", advanced,
                                   &pdlp_iteration_count, 0);
    records.push_back(record_int);

    record_int =
        new InfoRecordInt("qp_iteration_count", "Iteration count for QP solver",
                          advanced, &qp_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("primal_solution_status",
                                   "Model primal solution status: 0 => No "
                                   "solution; 1 => Infeasible point; "
                                   "2 => Feasible point",
                                   advanced, &primal_solution_status,
                                   kSolutionStatusNone);
    records.push_back(record_int);

    record_int =
        new InfoRecordInt("dual_solution_status",
                          "Model dual solution status: 0 => No solution; 1 => "
                          "Infeasible point; 2 "
                          "=> Feasible point",
                          advanced, &dual_solution_status, kSolutionStatusNone);
    records.push_back(record_int);

    record_int = new InfoRecordInt(
        "basis_validity", "Model basis validity: 0 => Invalid; 1 => Valid",
        advanced, &basis_validity, kBasisValidityInvalid);
    records.push_back(record_int);

    record_double = new InfoRecordDouble("objective_function_value",
                                         "Objective function value", advanced,
                                         &objective_function_value, 0);
    records.push_back(record_double);

    record_int64 =
        new InfoRecordInt64("mip_node_count", "MIP solver node count", advanced,
                            &mip_node_count, 0);
    records.push_back(record_int64);

    record_double =
        new InfoRecordDouble("mip_dual_bound", "MIP solver dual bound",
                             advanced, &mip_dual_bound, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble("mip_gap", "MIP solver gap (%)",
                                         advanced, &mip_gap, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble("max_integrality_violation",
                                         "Max integrality violation", advanced,
                                         &max_integrality_violation, 0);
    records.push_back(record_double);

    record_int = new InfoRecordInt("num_primal_infeasibilities",
                                   "Number of primal infeasibilities", advanced,
                                   &num_primal_infeasibilities, -1);
    records.push_back(record_int);

    record_double = new InfoRecordDouble(
        "max_primal_infeasibility", "Maximum primal infeasibility", advanced,
        &max_primal_infeasibility, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_primal_infeasibilities", "Sum of primal infeasibilities", advanced,
        &sum_primal_infeasibilities, 0);
    records.push_back(record_double);

    record_int = new InfoRecordInt("num_dual_infeasibilities",
                                   "Number of dual infeasibilities", advanced,
                                   &num_dual_infeasibilities, -1);
    records.push_back(record_int);

    record_double = new InfoRecordDouble("max_dual_infeasibility",
                                         "Maximum dual infeasibility", advanced,
                                         &max_dual_infeasibility, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_dual_infeasibilities", "Sum of dual infeasibilities", advanced,
        &sum_dual_infeasibilities, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "max_complementarity_violation", "Max complementarity violation",
        advanced, &max_complementarity_violation, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_complementarity_violations", "Sum of complementarity violations",
        advanced, &sum_complementarity_violations, 0);
    records.push_back(record_double);

    record_double =
        new InfoRecordDouble("primal_dual_integral", "Primal-dual integral",
                             advanced, &primal_dual_integral, 0);
    records.push_back(record_double);
  }